

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O1

qsizetype __thiscall
QStringView::indexOf(QStringView *this,QChar c,qsizetype from,CaseSensitivity cs)

{
  long lVar1;
  storage_type_conflict *psVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  long lVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  lVar1 = this->m_size;
  lVar4 = -1;
  if (-from == lVar1 || -lVar1 < from) {
    lVar5 = 0;
    if (0 < lVar1 + from) {
      lVar5 = lVar1 + from;
    }
    if (-1 < from) {
      lVar5 = from;
    }
    if (lVar5 < lVar1) {
      psVar2 = this->m_data;
      QVar6.m_size = lVar1 * 2 + lVar5 * -2 >> 1;
      if (cs == CaseSensitive) {
        QVar6.m_data = psVar2 + lVar5;
        psVar3 = (storage_type_conflict *)QtPrivate::qustrchr(QVar6,c.ucs);
      }
      else {
        QVar7.m_data = psVar2 + lVar5;
        QVar7.m_size = QVar6.m_size;
        psVar3 = (storage_type_conflict *)QtPrivate::qustrcasechr(QVar7,c.ucs);
      }
      if (psVar3 != psVar2 + lVar1) {
        lVar4 = (long)psVar3 - (long)psVar2 >> 1;
      }
    }
  }
  return lVar4;
}

Assistant:

[[nodiscard]] qsizetype indexOf(QChar c, qsizetype from = 0, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::findString(*this, from, c.unicode(), cs); }